

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

error_t parse_opt(int key,char *arg,argp_state *state)

{
  if (key == 99) {
    *(char **)state->input = arg;
    return 0;
  }
  return 7;
}

Assistant:

static error_t
parse_opt (int key, char *arg, struct argp_state *state)
{
    struct arg_data *data = (struct arg_data *)state->input;
    switch (key)
    {
    case 'c':
        data->config_file = arg;
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}